

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

size_t exr_compress_max_buffer_size(size_t in_bytes)

{
  ulong uVar1;
  uint64_t uVar2;
  long in_RDI;
  size_t extra;
  size_t r;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = libdeflate_zlib_compress_bound(0,in_RDI);
  if (local_18 < 0xfffffffffffffff7) {
    local_18 = local_18 + 9;
    if (local_18 * 0x82 < local_18) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      uVar1 = local_18 * 0x82 >> 7;
      if (uVar1 < 0xffffffffffffff9c) {
        if (local_18 < uVar1) {
          local_18 = uVar1;
        }
        uVar2 = internal_exr_huf_compress_spare_bytes();
        if (local_18 < in_RDI + uVar2) {
          local_18 = in_RDI + uVar2;
        }
        uVar2 = internal_exr_huf_decompress_spare_bytes();
        if (local_18 < in_RDI + uVar2) {
          local_18 = in_RDI + uVar2;
        }
        if (local_18 < 0x2000) {
          local_18 = 0x2000;
        }
        local_8 = local_18;
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t
exr_compress_max_buffer_size (size_t in_bytes)
{
    size_t r, extra;

    r = libdeflate_zlib_compress_bound (NULL, in_bytes);
    /*
     * lib deflate has a message about needing a 9 byte boundary
     * but is unclear if it actually adds that or not
     * (see the comment on libdeflate_deflate_compress)
     */
    if (r > (SIZE_MAX - 9)) return (size_t) (SIZE_MAX);
    r += 9;

    /*
     * old library had uiAdd( uiAdd( in, ceil(in * 0.01) ), 100 )
     */
    extra = (r * (size_t) 130);
    if (extra < r) return (size_t) (SIZE_MAX);
    extra /= (size_t) 128;

    if (extra > (SIZE_MAX - 100)) return (size_t) (SIZE_MAX);
    if (extra > r) r = extra;

    /*
     * in case huf is larger than zlib
     */
    extra = in_bytes + internal_exr_huf_compress_spare_bytes ();
    if (r < extra) r = extra;

    extra = in_bytes + internal_exr_huf_decompress_spare_bytes ();
    if (r < extra) r = extra;

    /* make sure there is some small 2 pages worth of buffer */
    if (8192 > r) r = 8192;

    return r;
}